

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::StoreMatches(cmMakefile *this,RegularExpression *re)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  string *name;
  long lVar4;
  string_view value;
  string_view value_00;
  char nMatches [2];
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  name = matchVariables_abi_cxx11_;
  lVar4 = 0;
  iVar3 = 0;
  do {
    pcVar1 = (re->regmatch).startp[lVar4];
    if (pcVar1 != (char *)0x0) {
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pcVar1,(re->regmatch).endp[lVar4]);
      if (local_48 != 0) {
        value._M_str = (char *)local_50;
        value._M_len = local_48;
        AddDefinition(this,name,value);
        cmStateSnapshot::GetDefinition(&this->StateSnapshot,name);
        iVar3 = (int)lVar4 + 0x30;
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
    }
    lVar4 = lVar4 + 1;
    name = name + 1;
  } while (lVar4 != 10);
  local_50._0_2_ = (ushort)(byte)iVar3;
  sVar2 = strlen((char *)&local_50);
  value_00._M_str = (char *)&local_50;
  value_00._M_len = sVar2;
  AddDefinition(this,&nMatchesVariable_abi_cxx11_,value_00);
  cmStateSnapshot::GetDefinition(&this->StateSnapshot,&nMatchesVariable_abi_cxx11_);
  return;
}

Assistant:

void cmMakefile::StoreMatches(cmsys::RegularExpression& re)
{
  char highest = 0;
  for (int i = 0; i < 10; i++) {
    std::string const& m = re.match(i);
    if (!m.empty()) {
      std::string const& var = matchVariables[i];
      this->AddDefinition(var, m);
      this->MarkVariableAsUsed(var);
      highest = static_cast<char>('0' + i);
    }
  }
  char nMatches[] = { highest, '\0' };
  this->AddDefinition(nMatchesVariable, nMatches);
  this->MarkVariableAsUsed(nMatchesVariable);
}